

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetItemAccessors
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var *getter,Var *setter)

{
  bool bVar1;
  BOOL BVar2;
  IndexPropertyDescriptorMap *this_00;
  void **ppvVar3;
  bool local_51;
  IndexPropertyDescriptor *local_48;
  IndexPropertyDescriptor *descriptor;
  Var *setter_local;
  Var *getter_local;
  DynamicObject *pDStack_28;
  uint32 index_local;
  DynamicObject *instance_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  descriptor = (IndexPropertyDescriptor *)setter;
  setter_local = getter;
  getter_local._4_4_ = index;
  pDStack_28 = instance;
  instance_local = (DynamicObject *)arr;
  arr_local = (ES5Array *)this;
  this_00 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                      (&this->indexPropertyMap);
  bVar1 = IndexPropertyDescriptorMap::TryGetReference(this_00,getter_local._4_4_,&local_48);
  if (bVar1) {
    if ((local_48->Attributes & 8) != 0) {
      return 0;
    }
    BVar2 = HasDataItem(this,(ES5Array *)instance_local,getter_local._4_4_);
    if (BVar2 == 0) {
      ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&local_48->Getter);
      *setter_local = *ppvVar3;
      ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&local_48->Setter);
      *(void **)descriptor = *ppvVar3;
      ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&local_48->Getter);
      local_51 = true;
      if (*ppvVar3 == (void *)0x0) {
        ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&local_48->Setter);
        local_51 = *ppvVar3 != (void *)0x0;
      }
      return (uint)local_51;
    }
  }
  return 0;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetItemAccessors(ES5Array* arr, DynamicObject* instance, uint32 index, Var* getter, Var* setter)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (!HasDataItem(arr, index)) // if not shadowed by data item
            {
                *getter = descriptor->Getter;
                *setter = descriptor->Setter;
                return descriptor->Getter || descriptor->Setter;
            }
        }

        return false;
    }